

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * __thiscall minja::Value::operator-(Value *__return_storage_ptr__,Value *this,Value *rhs)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double local_20;
  
  if (((byte)((this->primitive_).m_data.m_type - number_integer) < 2) &&
     ((byte)((rhs->primitive_).m_data.m_type - number_integer) < 2)) {
    lVar1 = get<long>(this);
    lVar2 = get<long>(rhs);
    local_20 = (double)(lVar1 - lVar2);
    Value(__return_storage_ptr__,(int64_t *)&local_20);
  }
  else {
    dVar3 = get<double>(this);
    local_20 = get<double>(rhs);
    local_20 = dVar3 - local_20;
    Value(__return_storage_ptr__,&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

Value operator-(const Value& rhs) const {
      if (is_number_integer() && rhs.is_number_integer())
        return get<int64_t>() - rhs.get<int64_t>();
      else
        return get<double>() - rhs.get<double>();
  }